

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

void lys_precompile_augments_deviations_revert(ly_ctx *ctx,lys_module *mod)

{
  long *plVar1;
  lyd_node *plVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((ctx->list).count != 0) {
    uVar8 = 0;
    do {
      plVar2 = (ctx->list).field_2.dnodes[uVar8];
      pvVar3 = plVar2[1].priv;
      if (pvVar3 != (void *)0x0) {
        uVar4 = *(ulong *)((long)pvVar3 + -8);
        if (uVar4 != 0) {
          sVar6 = uVar4 * 8;
          uVar7 = 0;
          do {
            sVar6 = sVar6 - 8;
            if (*(lys_module **)((long)pvVar3 + uVar7 * 8) == mod) {
              if (uVar7 < uVar4 - 1) {
                memmove((void *)((long)pvVar3 + uVar7 * 8),(void *)((long)pvVar3 + uVar7 * 8 + 8),
                        sVar6);
              }
              plVar1 = (long *)((long)plVar2[1].priv + -8);
              *plVar1 = *plVar1 + -1;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pvVar3 = plVar2[1].priv;
        if (pvVar3 != (void *)0x0) {
          if (*(long *)((long)pvVar3 + -8) != 0) goto LAB_00153e16;
          if (pvVar3 != (void *)0x0) {
            free((void *)((long)pvVar3 + -8));
          }
        }
        plVar2[1].priv = (void *)0x0;
      }
LAB_00153e16:
      lVar5 = *(long *)(plVar2 + 2);
      if (lVar5 != 0) {
        uVar4 = *(ulong *)(lVar5 + -8);
        if (uVar4 != 0) {
          sVar6 = uVar4 * 8;
          uVar7 = 0;
          do {
            sVar6 = sVar6 - 8;
            if (*(lys_module **)(lVar5 + uVar7 * 8) == mod) {
              if (uVar7 < uVar4 - 1) {
                memmove((void *)(lVar5 + uVar7 * 8),(void *)(lVar5 + uVar7 * 8 + 8),sVar6);
              }
              *(long *)(*(long *)(plVar2 + 2) + -8) = *(long *)(*(long *)(plVar2 + 2) + -8) + -1;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar5 = *(long *)(plVar2 + 2);
        if (lVar5 != 0) {
          if (*(long *)(lVar5 + -8) != 0) goto LAB_00153e91;
          if (lVar5 != 0) {
            free((void *)(lVar5 + -8));
          }
        }
        plVar2[2].hash = 0;
        plVar2[2].flags = 0;
      }
LAB_00153e91:
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ctx->list).count);
  }
  return;
}

Assistant:

void
lys_precompile_augments_deviations_revert(struct ly_ctx *ctx, const struct lys_module *mod)
{
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u, count;
    struct lys_module *m;

    for (i = 0; i < ctx->list.count; ++i) {
        m = ctx->list.objs[i];

        if (m->augmented_by) {
            count = LY_ARRAY_COUNT(m->augmented_by);
            for (u = 0; u < count; ++u) {
                if (m->augmented_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->augmented_by + u, m->augmented_by + u + 1, (count - u - 1) * sizeof *m->augmented_by);
                    }
                    LY_ARRAY_DECREMENT(m->augmented_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->augmented_by)) {
                LY_ARRAY_FREE(m->augmented_by);
                m->augmented_by = NULL;
            }
        }

        if (m->deviated_by) {
            count = LY_ARRAY_COUNT(m->deviated_by);
            for (u = 0; u < count; ++u) {
                if (m->deviated_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->deviated_by + u, m->deviated_by + u + 1, (count - u - 1) * sizeof *m->deviated_by);
                    }
                    LY_ARRAY_DECREMENT(m->deviated_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->deviated_by)) {
                LY_ARRAY_FREE(m->deviated_by);
                m->deviated_by = NULL;
            }
        }
    }
}